

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O0

int mg_session_send_hello_message(mg_session *session,mg_map *extra)

{
  uint uVar1;
  mg_session *in_RSI;
  int status_2;
  int status_1;
  int status;
  undefined4 in_stack_ffffffffffffffdc;
  uint8_t val;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint local_4;
  
  val = (uint8_t)((uint)in_stack_ffffffffffffffdc >> 0x18);
  uVar1 = mg_session_write_uint8
                    ((mg_session *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),val
                    );
  local_4 = uVar1;
  if (((uVar1 == 0) &&
      (local_4 = mg_session_write_uint8((mg_session *)(ulong)in_stack_ffffffffffffffe0,val),
      local_4 == 0)) &&
     (local_4 = mg_session_write_map(in_RSI,(mg_map *)((ulong)uVar1 << 0x20)), local_4 == 0)) {
    local_4 = mg_session_flush_message(in_RSI);
  }
  return local_4;
}

Assistant:

int mg_session_send_hello_message(mg_session *session, const mg_map *extra) {
  MG_RETURN_IF_FAILED(
      mg_session_write_uint8(session, (uint8_t)(MG_MARKER_TINY_STRUCT + 1)));
  MG_RETURN_IF_FAILED(
      mg_session_write_uint8(session, MG_SIGNATURE_MESSAGE_HELLO));
  MG_RETURN_IF_FAILED(mg_session_write_map(session, extra));
  return mg_session_flush_message(session);
}